

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContentSpecNode.cpp
# Opt level: O2

int __thiscall xercesc_4_0::ContentSpecNode::getMinTotalRange(ContentSpecNode *this)

{
  NodeTypes NVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  NVar1 = this->fType;
  iVar5 = this->fMinOccurs;
  if (NVar1 == All || (NVar1 & (Any_NS|Any)) == Choice) {
    iVar3 = getMinTotalRange(this->fFirst);
    if (this->fSecond != (ContentSpecNode *)0x0) {
      iVar4 = getMinTotalRange(this->fSecond);
      iVar2 = iVar4;
      if (iVar3 < iVar4) {
        iVar2 = iVar3;
      }
      iVar3 = iVar4 + iVar3;
      if ((NVar1 & (Any_NS|Any_Other)) == Choice) {
        iVar3 = iVar2;
      }
    }
    iVar5 = iVar5 * iVar3;
  }
  return iVar5;
}

Assistant:

int ContentSpecNode::getMinTotalRange() const {

    int min = fMinOccurs;

    if ((fType & 0x0f) == ContentSpecNode::Sequence
        || fType == ContentSpecNode::All
        || (fType & 0x0f) == ContentSpecNode::Choice) {

        int minFirst = fFirst->getMinTotalRange();

        if (fSecond) {

            int minSecond = fSecond->getMinTotalRange();

            if ((fType & 0x0f) == ContentSpecNode::Choice) {
                min = min * ((minFirst < minSecond)? minFirst : minSecond);
            }
            else {
                min = min * (minFirst + minSecond);
            }
        }
        else
            min = min * minFirst;
    }

    return min;
}